

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O1

char ctemplate_htmlparser::jsparser_buffer_get(jsparser_ctx *js,int pos)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if (-1 < pos) {
    __assert_fail("pos < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x106,"char ctemplate_htmlparser::jsparser_buffer_get(jsparser_ctx *, int)");
  }
  uVar2 = 0xffffffff;
  if (-0x12 < pos) {
    iVar1 = js->buffer_end;
    iVar5 = iVar1 - js->buffer_start;
    iVar4 = (iVar1 + 0x12) - js->buffer_start;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    if (-iVar4 <= pos) {
      uVar3 = (iVar1 + pos) % 0x12;
      uVar2 = uVar3 + 0x12;
      if (-1 < (int)uVar3) {
        uVar2 = uVar3;
      }
    }
  }
  if (-1 < (int)uVar2) {
    return js->buffer[uVar2];
  }
  return '\0';
}

Assistant:

char jsparser_buffer_get(jsparser_ctx *js, int pos)
{
  int absolute_pos;
  assert(pos < 0);

  absolute_pos = jsparser_buffer_absolute_pos(js, pos);
  if (absolute_pos < 0) {
    return '\0';
  }

  return js->buffer[absolute_pos];
}